

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_donecanvasdialog(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  void *data;
  t_float tVar2;
  t_float tVar3;
  t_float tVar4;
  t_float tVar5;
  t_float tVar6;
  t_float tVar7;
  t_float tVar8;
  t_float tVar9;
  t_float tVar10;
  t_float tVar11;
  int fromgui;
  int redraw;
  int graphme;
  t_float ymargin;
  t_float xmargin;
  t_float ypix;
  t_float xpix;
  t_float y2;
  t_float x2;
  t_float y1;
  t_float x1;
  t_float yperpix;
  t_float xperpix;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  _glist *x_local;
  
  x1 = atom_getfloatarg(0,argc,argv);
  tVar2 = atom_getfloatarg(1,argc,argv);
  tVar3 = atom_getfloatarg(2,argc,argv);
  fromgui = (int)tVar3;
  tVar3 = atom_getfloatarg(3,argc,argv);
  tVar4 = atom_getfloatarg(4,argc,argv);
  tVar5 = atom_getfloatarg(5,argc,argv);
  tVar6 = atom_getfloatarg(6,argc,argv);
  tVar7 = atom_getfloatarg(7,argc,argv);
  tVar8 = atom_getfloatarg(8,argc,argv);
  tVar9 = atom_getfloatarg(9,argc,argv);
  tVar10 = atom_getfloatarg(10,argc,argv);
  tVar11 = atom_getfloatarg(0xb,argc,argv);
  if (((int)tVar11 != 0) && ((fromgui & 1U) == 0)) {
    fromgui = 0;
  }
  data = canvas_undo_set_canvas(x);
  canvas_undo_add(x,UNDO_CANVAS_APPLY,"apply",data);
  x->gl_pixwidth = (int)tVar7;
  x->gl_pixheight = (int)tVar8;
  x->gl_xmargin = (int)tVar9;
  x->gl_ymargin = (int)tVar10;
  y1 = -tVar2;
  if ((x1 == 0.0) && (!NAN(x1))) {
    x1 = 1.0;
  }
  if ((y1 == 0.0) && (!NAN(y1))) {
    y1 = 1.0;
  }
  if (fromgui == 0) {
    tVar2 = glist_dpixtodx(x,1.0);
    if ((x1 == tVar2) && (!NAN(x1) && !NAN(tVar2))) {
      glist_dpixtody(x,1.0);
    }
    if (x1 <= 0.0) {
      x->gl_x1 = -x1 * (float)(x->gl_screenx2 - x->gl_screenx1);
      x->gl_x2 = x->gl_x1 + x1;
    }
    else {
      x->gl_x1 = 0.0;
      x->gl_x2 = x1;
    }
    if (y1 <= 0.0) {
      x->gl_y1 = -y1 * (float)(x->gl_screeny2 - x->gl_screeny1);
      x->gl_y2 = x->gl_y1 + y1;
    }
    else {
      x->gl_y1 = 0.0;
      x->gl_y2 = y1;
    }
  }
  else {
    if ((tVar3 != tVar5) || (NAN(tVar3) || NAN(tVar5))) {
      x->gl_x1 = tVar3;
      x->gl_x2 = tVar5;
    }
    else {
      x->gl_x1 = 0.0;
      x->gl_x2 = 1.0;
    }
    if ((tVar4 != tVar6) || (NAN(tVar4) || NAN(tVar6))) {
      x->gl_y1 = tVar4;
      x->gl_y2 = tVar6;
    }
    else {
      x->gl_y1 = 0.0;
      x->gl_y2 = 1.0;
    }
  }
  canvas_setgraph(x,fromgui,0);
  canvas_dirty(x,1.0);
  if ((*(ushort *)&x->field_0xe8 & 1) == 0) {
    if (((*(ushort *)&x->field_0xe8 >> 0xb & 1) == 0) &&
       (iVar1 = glist_isvisible(x->gl_owner), iVar1 != 0)) {
      gobj_vis((t_gobj *)x,x->gl_owner,0);
      gobj_vis((t_gobj *)x,x->gl_owner,1);
    }
  }
  else {
    canvas_redraw(x);
  }
  return;
}

Assistant:

static void canvas_donecanvasdialog(t_glist *x,
    t_symbol *s, int argc, t_atom *argv)
{
    t_float xperpix, yperpix, x1, y1, x2, y2, xpix, ypix, xmargin, ymargin;
    int graphme, redraw = 0, fromgui;

    xperpix = atom_getfloatarg(0, argc, argv);
    yperpix = atom_getfloatarg(1, argc, argv);
    graphme = (int)(atom_getfloatarg(2, argc, argv));
    x1 = atom_getfloatarg(3, argc, argv);
    y1 = atom_getfloatarg(4, argc, argv);
    x2 = atom_getfloatarg(5, argc, argv);
    y2 = atom_getfloatarg(6, argc, argv);
    xpix = atom_getfloatarg(7, argc, argv);
    ypix = atom_getfloatarg(8, argc, argv);
    xmargin = atom_getfloatarg(9, argc, argv);
    ymargin = atom_getfloatarg(10, argc, argv);
    fromgui = atom_getfloatarg(11, argc, argv);
        /* hack - if graphme is 2 (meaning, not GOP but hide the text anyhow),
           perhaps we're happier with 0.  This is only checked if this is really
           being called, as intended, from the GUI.  For compatibility with old
           patches that reverse-engineered donecanvasdialog to modify patch
           parameters, we leave the buggy behavior in when there's no "fromgui"
           argument supplied. */
    if (fromgui && (!(graphme & 1)))
        graphme = 0;
        /* parent windows are treated the same as
           applies to individual objects */
    canvas_undo_add(x, UNDO_CANVAS_APPLY, "apply", canvas_undo_set_canvas(x));

    x->gl_pixwidth = xpix;
    x->gl_pixheight = ypix;
    x->gl_xmargin = xmargin;
    x->gl_ymargin = ymargin;

    yperpix = -yperpix;
    if (xperpix == 0)
        xperpix = 1;
    if (yperpix == 0)
        yperpix = 1;

    if (graphme)
    {
        if (x1 != x2)
            x->gl_x1 = x1, x->gl_x2 = x2;
        else x->gl_x1 = 0, x->gl_x2 = 1;
        if (y1 != y2)
            x->gl_y1 = y1, x->gl_y2 = y2;
        else x->gl_y1 = 0, x->gl_y2 = 1;
    }
    else
    {
        if (xperpix != glist_dpixtodx(x, 1) || yperpix != glist_dpixtody(x, 1))
            redraw = 1;
        if (xperpix > 0)
        {
            x->gl_x1 = 0;
            x->gl_x2 = xperpix;
        }
        else
        {
            x->gl_x1 = -xperpix * (x->gl_screenx2 - x->gl_screenx1);
            x->gl_x2 = x->gl_x1 + xperpix;
        }
        if (yperpix > 0)
        {
            x->gl_y1 = 0;
            x->gl_y2 = yperpix;
        }
        else
        {
            x->gl_y1 = -yperpix * (x->gl_screeny2 - x->gl_screeny1);
            x->gl_y2 = x->gl_y1 + yperpix;
        }
    }
        /* LATER avoid doing 2 redraws here (possibly one inside setgraph) */
    canvas_setgraph(x, graphme, 0);
    canvas_dirty(x, 1);
    if (x->gl_havewindow)
        canvas_redraw(x);
    else if (!x->gl_isclone && glist_isvisible(x->gl_owner))
    {
        gobj_vis(&x->gl_gobj, x->gl_owner, 0);
        gobj_vis(&x->gl_gobj, x->gl_owner, 1);
    }
}